

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char * kj::_::fill<kj::CappedArray<char,5ul>>(char *target,CappedArray<char,_5UL> *first)

{
  char *pcVar1;
  char *end;
  char *i;
  CappedArray<char,_5UL> *first_local;
  char *target_local;
  
  end = CappedArray<char,_5UL>::begin(first);
  pcVar1 = CappedArray<char,_5UL>::end(first);
  first_local = (CappedArray<char,_5UL> *)target;
  while (end != pcVar1) {
    *(char *)&first_local->currentSize = *end;
    end = end + 1;
    first_local = (CappedArray<char,_5UL> *)((long)&first_local->currentSize + 1);
  }
  pcVar1 = fill((char *)first_local);
  return pcVar1;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}